

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O3

void load(int r,SValue *sv)

{
  ushort uVar1;
  uint64_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint r2;
  ulong uVar6;
  char *fmt;
  uint64_t uVar7;
  uint uVar8;
  uint uVar9;
  uint64_t uVar10;
  bool bVar11;
  undefined1 local_98 [8];
  SValue v1;
  int align;
  
  uVar1 = sv->r;
  uVar4 = (uint)uVar1;
  uVar10 = (sv->c).i;
  uVar5 = (uint)uVar10;
  uVar7 = (uint64_t)(int)uVar5;
  if ((uVar1 >> 9 & 1) != 0 && uVar7 != uVar10) {
    fmt = "64 bit addend in load";
LAB_0012789f:
    tcc_error(fmt);
  }
  uVar9 = (sv->type).t;
  uVar8 = uVar9 & 0xfffffcdf;
  if (((uVar1 & 0x33f) == 0x330) && (((sv->sym->type).t & 0x2000) == 0)) {
    iVar3 = is_float(uVar8);
    uVar4 = r;
    if (iVar3 != 0) {
      uVar4 = get_reg(1);
    }
    gen_modrm64(0x8b,uVar4 | 0x20,(uint)uVar1,sv->sym,0);
    uVar4 = uVar4 | 0x120;
  }
  r2 = uVar4 & 0x3f;
  if ((uVar4 >> 8 & 1) == 0) {
    if (r2 == 0x33) {
      orex(0,r,0,0);
      uVar4 = r & 7;
      oad(uVar4 + 0xb8,(uint)((uVar5 & 0xfffffeff) == 0x95));
      if ((uVar5 >> 8 & 1) != 0) {
        uVar9 = (r & 8U) * 0x20 + 0x37a;
        do {
          g(uVar9);
          bVar11 = 0xff < uVar9;
          uVar9 = uVar9 >> 8;
        } while (bVar11);
        uVar10 = (uint64_t)(uVar5 & 0xfffffeff);
      }
      orex(0,r,0,0xf);
      if ((int)uVar10 != 0) {
        uVar6 = uVar10 & 0xffffffff;
        do {
          uVar5 = (uint)uVar10;
          g(uVar5);
          uVar6 = uVar6 >> 8;
          uVar10 = uVar6;
        } while (0xff < uVar5);
      }
    }
    else {
      if (r2 == 0x32) {
        orex(1,0,r,0x8d);
        gen_modrm_impl(r,0x32,sv->sym,uVar5,0);
        return;
      }
      if (r2 == 0x30) {
        if ((uVar4 >> 9 & 1) != 0) {
          iVar3 = (r & 7U) * 8 + 5;
          if (((sv->sym->type).t & 0x2000) == 0) {
            orex(1,0,r,0x8b);
            g(iVar3);
            gen_gotpcrel(r,sv->sym,uVar5);
            return;
          }
          orex(1,0,r,0x8d);
          g(iVar3);
          gen_addrpc32(uVar4,sv->sym,uVar5);
          return;
        }
        uVar4 = r & 7U | 0xb8;
        if ((uVar9 & 0xf) - 7 < 0xfffffffd) {
          orex(0,r,0,uVar4);
          gen_le32(uVar5);
          return;
        }
        orex(1,r,0,uVar4);
        gen_le64((sv->c).i);
        return;
      }
      if ((uVar4 & 0x3e) == 0x34) {
        orex(0,r,0,0);
        uVar8 = r & 7U | 0xb8;
        oad(uVar8,uVar4 & 1);
        uVar9 = (r & 8U) * 0x20 + 0x5eb;
        do {
          g(uVar9);
          bVar11 = 0xff < uVar9;
          uVar9 = uVar9 >> 8;
        } while (bVar11);
        gsym(uVar5);
        orex(0,r,0,0);
        oad(uVar8,uVar4 & 1 ^ 1);
        return;
      }
      if (r2 == r) {
        return;
      }
      if ((r & 0xfffffff8U) == 0x10) {
        if (r2 == 0x18) {
          uVar4 = 0xf0245cdd;
          do {
            g(uVar4);
            bVar11 = 0xff < uVar4;
            uVar4 = uVar4 >> 8;
          } while (bVar11);
          uVar4 = 0x100ff2;
          do {
            g(uVar4);
            bVar11 = 0xff < uVar4;
            uVar4 = uVar4 >> 8;
          } while (bVar11);
          g((r & 7U) * 8 + 0x44);
          uVar4 = 0xf024;
          do {
            g(uVar4);
            bVar11 = 0xff < uVar4;
            uVar4 = uVar4 >> 8;
          } while (bVar11);
          return;
        }
        if ((uVar4 & 0x38) == 0x10) {
          if ((uVar9 & 0xf) == 8) {
            uVar5 = 0x100ff3;
            do {
              g(uVar5);
              bVar11 = 0xff < uVar5;
              uVar5 = uVar5 >> 8;
            } while (bVar11);
          }
          else {
            if ((uVar9 & 0xf) != 9) {
              __assert_fail("(ft & VT_BTYPE) == VT_DOUBLE",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                            ,499,"void load(int, SValue *)");
            }
            uVar5 = 0x100ff2;
            do {
              g(uVar5);
              bVar11 = 0xff < uVar5;
              uVar5 = uVar5 >> 8;
            } while (bVar11);
          }
          uVar4 = (uVar4 & 7) + r * 8 | 0xc0;
          do {
            g(uVar4);
            bVar11 = 0xff < uVar4;
            uVar4 = 0;
          } while (bVar11);
          return;
        }
        __assert_fail("(v >= TREG_XMM0) && (v <= TREG_XMM7)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                      ,0x1ef,"void load(int, SValue *)");
      }
      if (r == 0x18) {
        if ((uVar4 & 0x38) == 0x10) {
          uVar4 = 0x110ff2;
          do {
            g(uVar4);
            bVar11 = 0xff < uVar4;
            uVar4 = uVar4 >> 8;
          } while (bVar11);
          g(0x44);
          uVar4 = 0xf024;
          do {
            g(uVar4);
            bVar11 = 0xff < uVar4;
            uVar4 = uVar4 >> 8;
          } while (bVar11);
          uVar4 = 0xf02444dd;
          do {
            g(uVar4);
            bVar11 = 0xff < uVar4;
            uVar4 = uVar4 >> 8;
          } while (bVar11);
          return;
        }
        __assert_fail("(v >= TREG_XMM0) && (v <= TREG_XMM7)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                      ,0x1f9,"void load(int, SValue *)");
      }
      orex(1,r,r2,0x89);
      uVar4 = (r & 7U) + (uVar4 & 0x1f) * 8;
    }
    g(uVar4 | 0xc0);
    return;
  }
  if (r2 == 0x31) {
    local_98._0_4_ = 5;
    v1.type.ref._0_2_ = 0x132;
    uVar4 = r;
    v1._24_8_ = uVar7;
    if ((0x1fff7f8UL >> ((ulong)(uint)r & 0x3f) & 1) != 0) {
      uVar4 = get_reg(1);
    }
    load(uVar4,(SValue *)local_98);
  }
  uVar2 = (sv->c).i;
  if (uVar7 != uVar2) {
    local_98._0_4_ = 4;
    v1.type.ref._0_2_ = 0x30;
    uVar4 = r;
    v1._24_8_ = uVar2;
    if ((0x1fff7f8UL >> ((ulong)(uint)r & 0x3f) & 1) != 0) {
      uVar4 = get_reg(1);
    }
    load(uVar4,(SValue *)local_98);
    uVar10 = 0;
  }
  if ((uVar9 & 0xf) == 7) {
    iVar3 = type_size(&sv->type,(int *)&v1.field_0x3c);
    uVar5 = iVar3 - 1;
    if ((7 < uVar5) || ((0x8bU >> (uVar5 & 0x1f) & 1) == 0)) {
      fmt = "invalid aggregate type for register load";
      goto LAB_0012789f;
    }
    uVar8 = *(uint *)(&DAT_00131150 + (ulong)uVar5 * 4);
  }
  uVar5 = uVar8 & 0xf;
  if (uVar5 == 10) {
    r = 5;
    iVar3 = 0xdb;
  }
  else if (uVar5 == 9) {
    r = r & 7;
    iVar3 = 0x7e0ff3;
  }
  else if (uVar5 == 8) {
    r = r & 7;
    iVar3 = 0x6e0f66;
  }
  else {
    uVar8 = uVar8 & 0xf0f7f;
    iVar3 = 0xbe0f;
    if (uVar8 < 0xb) {
      if (uVar8 == 1) goto LAB_0012753b;
      if (uVar8 == 2) {
        iVar3 = 0xbf0f;
        goto LAB_0012753b;
      }
    }
    else {
      if (uVar8 == 0xb) goto LAB_0012753b;
      if (uVar8 == 0x12) {
        iVar3 = 0xb70f;
        goto LAB_0012753b;
      }
      if (uVar8 == 0x11) {
        iVar3 = 0xb60f;
        goto LAB_0012753b;
      }
    }
    if (3 < uVar5 - 3) {
      __assert_fail("((ft & VT_BTYPE) == VT_INT) || ((ft & VT_BTYPE) == VT_LLONG) || ((ft & VT_BTYPE) == VT_PTR) || ((ft & VT_BTYPE) == VT_FUNC)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                    ,0x1a7,"void load(int, SValue *)");
    }
    iVar3 = 0x8b;
    if (3 < uVar5) {
      gen_modrm64(0x8b,r,uVar4,sv->sym,(int)uVar10);
      return;
    }
  }
LAB_0012753b:
  orex(0,uVar4,r,iVar3);
  gen_modrm_impl(r,uVar4,sv->sym,(int)uVar10,0);
  return;
}

Assistant:

void load(int r, SValue* sv) {
  int v, t, ft, fc, fr;
  SValue v1;

#ifdef TCC_TARGET_PE
  SValue v2;
  sv = pe_getimport(sv, &v2);
#endif

  fr = sv->r;
  ft = sv->type.t & ~VT_DEFSIGN;
  fc = sv->c.i;
  if (fc != sv->c.i && (fr & VT_SYM))
    tcc_error("64 bit addend in load");

  ft &= ~(VT_VOLATILE | VT_CONSTANT);

#ifndef TCC_TARGET_PE
  /* we use indirect access via got */
  if ((fr & VT_VALMASK) == VT_CONST && (fr & VT_SYM) && (fr & VT_LVAL) && !(sv->sym->type.t & VT_STATIC)) {
    /* use the result register as a temporal register */
    int tr = r | TREG_MEM;
    if (is_float(ft)) {
      /* we cannot use float registers as a temporal register */
      tr = get_reg(RC_INT) | TREG_MEM;
    }
    gen_modrm64(0x8b, tr, fr, sv->sym, 0);

    /* load from the temporal register */
    fr = tr | VT_LVAL;
  }
#endif

  v = fr & VT_VALMASK;
  if (fr & VT_LVAL) {
    int b, ll;
    if (v == VT_LLOCAL) {
      v1.type.t = VT_PTR;
      v1.r = VT_LOCAL | VT_LVAL;
      v1.c.i = fc;
      fr = r;
      if (!(reg_classes[fr] & (RC_INT | RC_R11)))
        fr = get_reg(RC_INT);
      load(fr, &v1);
    }
    if (fc != sv->c.i) {
      /* If the addends doesn't fit into a 32bit signed
         we must use a 64bit move.  We've checked above
         that this doesn't have a sym associated.  */
      v1.type.t = VT_LLONG;
      v1.r = VT_CONST;
      v1.c.i = sv->c.i;
      fr = r;
      if (!(reg_classes[fr] & (RC_INT | RC_R11)))
        fr = get_reg(RC_INT);
      load(fr, &v1);
      fc = 0;
    }
    ll = 0;
    /* Like GCC we can load from small enough properly sized
       structs and unions as well.
       XXX maybe move to generic operand handling, but should
       occur only with asm, so tccasm.c might also be a better place */
    if ((ft & VT_BTYPE) == VT_STRUCT) {
      int align;
      switch (type_size(&sv->type, &align)) {
        case 1:
          ft = VT_BYTE;
          break;
        case 2:
          ft = VT_SHORT;
          break;
        case 4:
          ft = VT_INT;
          break;
        case 8:
          ft = VT_LLONG;
          break;
        default:
          tcc_error("invalid aggregate type for register load");
          break;
      }
    }
    if ((ft & VT_BTYPE) == VT_FLOAT) {
      b = 0x6e0f66;
      r = REG_VALUE(r); /* movd */
    } else if ((ft & VT_BTYPE) == VT_DOUBLE) {
      b = 0x7e0ff3; /* movq */
      r = REG_VALUE(r);
    } else if ((ft & VT_BTYPE) == VT_LDOUBLE) {
      b = 0xdb, r = 5; /* fldt */
    } else if ((ft & VT_TYPE) == VT_BYTE || (ft & VT_TYPE) == VT_BOOL) {
      b = 0xbe0f; /* movsbl */
    } else if ((ft & VT_TYPE) == (VT_BYTE | VT_UNSIGNED)) {
      b = 0xb60f; /* movzbl */
    } else if ((ft & VT_TYPE) == VT_SHORT) {
      b = 0xbf0f; /* movswl */
    } else if ((ft & VT_TYPE) == (VT_SHORT | VT_UNSIGNED)) {
      b = 0xb70f; /* movzwl */
    } else {
      assert(((ft & VT_BTYPE) == VT_INT) || ((ft & VT_BTYPE) == VT_LLONG) || ((ft & VT_BTYPE) == VT_PTR) ||
             ((ft & VT_BTYPE) == VT_FUNC));
      ll = is64_type(ft);
      b = 0x8b;
    }
    if (ll) {
      gen_modrm64(b, r, fr, sv->sym, fc);
    } else {
      orex(ll, fr, r, b);
      gen_modrm(r, fr, sv->sym, fc);
    }
  } else {
    if (v == VT_CONST) {
      if (fr & VT_SYM) {
#ifdef TCC_TARGET_PE
        orex(1, 0, r, 0x8d);
        o(0x05 + REG_VALUE(r) * 8); /* lea xx(%rip), r */
        gen_addrpc32(fr, sv->sym, fc);
#else
        if (sv->sym->type.t & VT_STATIC) {
          orex(1, 0, r, 0x8d);
          o(0x05 + REG_VALUE(r) * 8); /* lea xx(%rip), r */
          gen_addrpc32(fr, sv->sym, fc);
        } else {
          orex(1, 0, r, 0x8b);
          o(0x05 + REG_VALUE(r) * 8); /* mov xx(%rip), r */
          gen_gotpcrel(r, sv->sym, fc);
        }
#endif
      } else if (is64_type(ft)) {
        orex(1, r, 0, 0xb8 + REG_VALUE(r)); /* mov $xx, r */
        gen_le64(sv->c.i);
      } else {
        orex(0, r, 0, 0xb8 + REG_VALUE(r)); /* mov $xx, r */
        gen_le32(fc);
      }
    } else if (v == VT_LOCAL) {
      orex(1, 0, r, 0x8d); /* lea xxx(%ebp), r */
      gen_modrm(r, VT_LOCAL, sv->sym, fc);
    } else if (v == VT_CMP) {
      orex(0, r, 0, 0);
      if ((fc & ~0x100) != TOK_NE)
        oad(0xb8 + REG_VALUE(r), 0); /* mov $0, r */
      else
        oad(0xb8 + REG_VALUE(r), 1); /* mov $1, r */
      if (fc & 0x100) {
        /* This was a float compare.  If the parity bit is
       set the result was unordered, meaning false for everything
       except TOK_NE, and true for TOK_NE.  */
        fc &= ~0x100;
        o(0x037a + (REX_BASE(r) << 8));
      }
      orex(0, r, 0, 0x0f); /* setxx %br */
      o(fc);
      o(0xc0 + REG_VALUE(r));
    } else if (v == VT_JMP || v == VT_JMPI) {
      t = v & 1;
      orex(0, r, 0, 0);
      oad(0xb8 + REG_VALUE(r), t); /* mov $1, r */
      o(0x05eb + (REX_BASE(r) << 8)); /* jmp after */
      gsym(fc);
      orex(0, r, 0, 0);
      oad(0xb8 + REG_VALUE(r), t ^ 1); /* mov $0, r */
    } else if (v != r) {
      if ((r >= TREG_XMM0) && (r <= TREG_XMM7)) {
        if (v == TREG_ST0) {
          /* gen_cvt_ftof(VT_DOUBLE); */
          o(0xf0245cdd); /* fstpl -0x10(%rsp) */
          /* movsd -0x10(%rsp),%xmmN */
          o(0x100ff2);
          o(0x44 + REG_VALUE(r) * 8); /* %xmmN */
          o(0xf024);
        } else {
          assert((v >= TREG_XMM0) && (v <= TREG_XMM7));
          if ((ft & VT_BTYPE) == VT_FLOAT) {
            o(0x100ff3);
          } else {
            assert((ft & VT_BTYPE) == VT_DOUBLE);
            o(0x100ff2);
          }
          o(0xc0 + REG_VALUE(v) + REG_VALUE(r) * 8);
        }
      } else if (r == TREG_ST0) {
        assert((v >= TREG_XMM0) && (v <= TREG_XMM7));
        /* gen_cvt_ftof(VT_LDOUBLE); */
        /* movsd %xmmN,-0x10(%rsp) */
        o(0x110ff2);
        o(0x44 + REG_VALUE(r) * 8); /* %xmmN */
        o(0xf024);
        o(0xf02444dd); /* fldl -0x10(%rsp) */
      } else {
        orex(1, r, v, 0x89);
        o(0xc0 + REG_VALUE(r) + REG_VALUE(v) * 8); /* mov v, r */
      }
    }
  }
}